

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O0

int look_here(int obj_cnt,boolean picked_some)

{
  obj *obj;
  monst *mon;
  undefined8 __s1;
  boolean bVar1;
  boolean bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  trap *ptVar7;
  bool bVar8;
  bool local_2d6;
  byte local_2d5;
  bool local_2ba;
  byte local_2b9;
  char *local_2a8;
  bool local_292;
  byte local_291;
  boolean drift;
  monst *mtmp;
  boolean skip_win;
  char *title;
  nh_objitem *items;
  int local_240;
  int size;
  int icount;
  boolean skip_objects;
  char fbuf2 [256];
  char fbuf [256];
  char *dfeature;
  char *verb;
  trap *trap;
  obj *otmp;
  uint uStack_c;
  boolean picked_some_local;
  int obj_cnt_local;
  
  if ((u.uprops[0x1e].intrinsic != 0) ||
     (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
      (bVar8 = false, ((youmonst.data)->mflags1 & 0x1000) != 0)))) {
    bVar8 = false;
    if (ublindf != (obj *)0x0) {
      bVar8 = ublindf->oartifact == '\x1d';
    }
    bVar8 = (bool)(bVar8 ^ 1);
  }
  pcVar4 = "not see";
  if (bVar8) {
    pcVar4 = "You feel";
  }
  pcVar4 = pcVar4 + 4;
  fbuf[0xf8] = '\0';
  fbuf[0xf9] = '\0';
  fbuf[0xfa] = '\0';
  fbuf[0xfb] = '\0';
  fbuf[0xfc] = '\0';
  fbuf[0xfd] = '\0';
  fbuf[0xfe] = '\0';
  fbuf[0xff] = '\0';
  size._3_1_ = iflags.pilesize < obj_cnt;
  local_240 = 0;
  items._4_4_ = 10;
  title = (char *)0x0;
  if (((u.uprops[0x1e].intrinsic != 0) || ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))) ||
     (bVar8 = false, ((youmonst.data)->mflags1 & 0x1000) != 0)) {
    bVar8 = false;
    if (ublindf != (obj *)0x0) {
      bVar8 = ublindf->oartifact == '\x1d';
    }
    bVar8 = (bool)(bVar8 ^ 1);
  }
  pcVar5 = "Things that are here:";
  if (bVar8) {
    pcVar5 = "Things that you feel here:";
  }
  bVar1 = update_location((size._3_1_ ^ 0xffU) & 1);
  mon = u.ustuck;
  if (((u._1052_1_ & 1) == 0) || (u.ustuck == (monst *)0x0)) {
    if ((size._3_1_ == '\0') &&
       ((ptVar7 = t_at(level,(int)u.ux,(int)u.uy), ptVar7 != (trap *)0x0 &&
        (((byte)ptVar7->field_0x8 >> 5 & 1) != 0)))) {
      pcVar6 = an(trapexplain[(int)((ptVar7->field_0x8 & 0x1f) - 1)]);
      pline("There is %s here.",pcVar6);
    }
    obj = level->objects[u.ux][u.uy];
    fbuf._248_8_ = dfeature_at((int)u.ux,(int)u.uy,(char *)&icount);
    if ((((char *)fbuf._248_8_ != (char *)0x0) &&
        (iVar3 = strcmp((char *)fbuf._248_8_,"pool of water"), iVar3 == 0)) &&
       (((byte)u._1052_1_ >> 1 & 1) != 0)) {
      fbuf[0xf8] = '\0';
      fbuf[0xf9] = '\0';
      fbuf[0xfa] = '\0';
      fbuf[0xfb] = '\0';
      fbuf[0xfc] = '\0';
      fbuf[0xfd] = '\0';
      fbuf[0xfe] = '\0';
      fbuf[0xff] = '\0';
    }
    if ((((u.uprops[0x1e].intrinsic != 0) || ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed))))
        || (((youmonst.data)->mflags1 & 0x1000) != 0)) &&
       ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) {
      bVar2 = on_level(&u.uz,&dungeon_topology.d_air_level);
      bVar8 = true;
      if (bVar2 == '\0') {
        bVar2 = on_level(&u.uz,&dungeon_topology.d_water_level);
        bVar8 = bVar2 != '\0';
      }
      if ((fbuf._248_8_ == 0) || (iVar3 = strncmp((char *)fbuf._248_8_,"altar ",6), iVar3 != 0)) {
        pcVar6 = "lying here on the ";
        if (bVar8) {
          pcVar6 = "floating here";
          local_2a8 = "";
        }
        else {
          local_2a8 = surface((int)u.ux,(int)u.uy);
        }
        pline("You try to feel what is %s%s.",pcVar6,local_2a8);
      }
      else {
        pline("You try to feel what is here.");
      }
      __s1 = fbuf._248_8_;
      if ((fbuf._248_8_ != 0) && (!bVar8)) {
        pcVar6 = surface((int)u.ux,(int)u.uy);
        iVar3 = strcmp((char *)__s1,pcVar6);
        if (iVar3 == 0) {
          fbuf[0xf8] = '\0';
          fbuf[0xf9] = '\0';
          fbuf[0xfa] = '\0';
          fbuf[0xfb] = '\0';
          fbuf[0xfc] = '\0';
          fbuf[0xfd] = '\0';
          fbuf[0xfe] = '\0';
          fbuf[0xff] = '\0';
        }
      }
      bVar2 = can_reach_floor();
      if (bVar2 == '\0') {
        pline("But you can\'t reach it!");
        return 0;
      }
    }
    if (fbuf._248_8_ != 0) {
      pcVar6 = an((char *)fbuf._248_8_);
      sprintf(fbuf2 + 0xf8,"There is %s here.",pcVar6);
    }
    if (((obj == (obj *)0x0) || (bVar2 = is_lava(level,(int)u.ux,(int)u.uy), bVar2 != '\0')) ||
       ((bVar2 = is_pool(level,(int)u.ux,(int)u.uy), bVar2 != '\0' &&
        (((byte)u._1052_1_ >> 1 & 1) == 0)))) {
      if (fbuf._248_8_ != 0) {
        pline(fbuf2 + 0xf8);
      }
      read_engr_at((int)u.ux,(int)u.uy);
      if ((size._3_1_ == '\0') &&
         ((((u.uprops[0x1e].intrinsic != 0 ||
            (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
             (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
           ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) || (fbuf._248_8_ == 0)))) {
        pline("You %s no objects here.",pcVar4);
      }
      if (((u.uprops[0x1e].intrinsic != 0) || ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed))))
         || (local_2b9 = 0, ((youmonst.data)->mflags1 & 0x1000) != 0)) {
        local_2ba = false;
        if (ublindf != (obj *)0x0) {
          local_2ba = ublindf->oartifact == '\x1d';
        }
        local_2b9 = local_2ba ^ 0xff;
      }
      uStack_c = (uint)(local_2b9 & 1);
    }
    else {
      if (size._3_1_ == '\0') {
        if ((obj->v).v_nexthere == (obj *)0x0) {
          if (fbuf._248_8_ != 0) {
            pline(fbuf2 + 0xf8);
          }
          read_engr_at((int)u.ux,(int)u.uy);
          pcVar5 = doname_price(obj);
          pline("You %s here %s.",pcVar4,pcVar5);
          if (((obj->otyp == 0x10e) && (bVar1 = will_feel_cockatrice(obj,'\0'), bVar1 != '\0')) &&
             (u.uprops[0x21].intrinsic == 0)) {
            feel_cockatrice(obj,'\0');
            return 1;
          }
        }
        else {
          trap = (trap *)level->objects[u.ux][u.uy];
          while ((trap != (trap *)0x0 &&
                 ((*(short *)&trap[1].field_0x12 != 0x10e ||
                  (bVar2 = will_feel_cockatrice((obj *)trap,'\0'), bVar2 == '\0'))))) {
            trap = *(trap **)&trap->field_0x8;
          }
          if ((trap != (trap *)0x0) && (u.uprops[0x21].intrinsic == 0)) {
            pcVar5 = doname_price((obj *)trap);
            pline("You %s here %s.",pcVar4,pcVar5);
            feel_cockatrice((obj *)trap,'\0');
            return 1;
          }
          title = (char *)malloc((long)items._4_4_ * 0x124);
          iVar3 = local_240;
          if (fbuf._248_8_ != 0) {
            local_240 = local_240 + 1;
            add_objitem((nh_objitem **)&title,(int *)((long)&items + 4),MI_TEXT,iVar3,0,fbuf2 + 0xf8
                        ,(obj *)0x0,'\0');
            iVar3 = local_240;
            local_240 = local_240 + 1;
            add_objitem((nh_objitem **)&title,(int *)((long)&items + 4),MI_TEXT,iVar3,0,"",
                        (obj *)0x0,'\0');
          }
          for (trap = (trap *)level->objects[u.ux][u.uy]; iVar3 = local_240, trap != (trap *)0x0;
              trap = *(trap **)&trap->field_0x8) {
            local_240 = local_240 + 1;
            pcVar4 = doname((obj *)trap);
            add_objitem((nh_objitem **)&title,(int *)((long)&items + 4),MI_NORMAL,iVar3,0,pcVar4,
                        (obj *)trap,'\0');
          }
          if (bVar1 == '\0' || obj_cnt == 0) {
            display_objects((nh_objitem *)title,local_240,pcVar5,0,(nh_objresult *)0x0);
          }
          free(title);
          read_engr_at((int)u.ux,(int)u.uy);
        }
      }
      else {
        if (fbuf._248_8_ != 0) {
          pline(fbuf2 + 0xf8);
        }
        read_engr_at((int)u.ux,(int)u.uy);
        pcVar4 = "many";
        if (obj_cnt < 0xb) {
          pcVar4 = "several";
        }
        pcVar5 = "";
        if (picked_some != '\0') {
          pcVar5 = " more";
        }
        pline("There are %s%s objects here.",pcVar4,pcVar5);
      }
      if (((u.uprops[0x1e].intrinsic != 0) || ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed))))
         || (local_2d5 = 0, ((youmonst.data)->mflags1 & 0x1000) != 0)) {
        local_2d6 = false;
        if (ublindf != (obj *)0x0) {
          local_2d6 = ublindf->oartifact == '\x1d';
        }
        local_2d5 = local_2d6 ^ 0xff;
      }
      uStack_c = (uint)(local_2d5 & 1);
    }
  }
  else {
    pcVar5 = mon_nam(u.ustuck);
    pcVar5 = s_suffix(pcVar5);
    pcVar6 = mbodypart(mon,0x12);
    sprintf(fbuf2 + 0xf8,"Contents of %s %s",pcVar5,pcVar6);
    if (((u.uprops[0x1e].intrinsic != 0) || ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))) ||
       (bVar8 = false, ((youmonst.data)->mflags1 & 0x1000) != 0)) {
      bVar8 = false;
      if (ublindf != (obj *)0x0) {
        bVar8 = ublindf->oartifact == '\x1d';
      }
      bVar8 = (bool)(bVar8 ^ 1);
    }
    pcVar5 = "look around";
    if (bVar8) {
      pcVar5 = "try";
    }
    pline("You %s to %s what is lying in %s.",pcVar5,pcVar4,fbuf + 4);
    trap = (trap *)mon->minvent;
    if ((obj *)trap == (obj *)0x0) {
      pline("You %s no objects here.",pcVar4);
    }
    else {
      while ((trap != (trap *)0x0 &&
             ((*(short *)&trap[1].field_0x12 != 0x10e ||
              (bVar1 = will_feel_cockatrice((obj *)trap,'\0'), bVar1 == '\0'))))) {
        trap = trap->ntrap;
      }
      if ((trap != (trap *)0x0) && (u.uprops[0x21].intrinsic == 0)) {
        pcVar5 = doname_price((obj *)trap);
        pline("You %s here %s.",pcVar4,pcVar5);
        feel_cockatrice((obj *)trap,'\0');
        return 1;
      }
      if (((u.uprops[0x1e].intrinsic != 0) ||
          (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
           (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
         ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) {
        strcpy(fbuf2 + 0xf8,"You feel");
      }
      strcat(fbuf2 + 0xf8,":");
      display_minventory(mon,2,fbuf2 + 0xf8);
    }
    if (((u.uprops[0x1e].intrinsic != 0) || ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))) ||
       (local_291 = 0, ((youmonst.data)->mflags1 & 0x1000) != 0)) {
      local_292 = false;
      if (ublindf != (obj *)0x0) {
        local_292 = ublindf->oartifact == '\x1d';
      }
      local_291 = local_292 ^ 0xff;
    }
    uStack_c = (uint)(local_291 & 1);
  }
  return uStack_c;
}

Assistant:

int look_here(int obj_cnt, /* obj_cnt > 0 implies that autopickup is in progess */
	      boolean picked_some)
{
	struct obj *otmp;
	struct trap *trap;
	const char *verb = Blind ? "feel" : "see";
	const char *dfeature = NULL;
	char fbuf[BUFSZ], fbuf2[BUFSZ];
	boolean skip_objects = (obj_cnt > iflags.pilesize);
	int icount = 0;
	int size = 10;
	struct nh_objitem *items = NULL;
	const char *title = Blind ? "Things that you feel here:" :
				    "Things that are here:";

	/* show the "things that are here" window iff
	 * - the player didn't get the info via update_location -OR-
	 * - it was explicitly requested (obj_cnt == 0) */
	boolean skip_win = update_location(!skip_objects) && obj_cnt;

	if (u.uswallow && u.ustuck) {
	    struct monst *mtmp = u.ustuck;
	    sprintf(fbuf, "Contents of %s %s",
		s_suffix(mon_nam(mtmp)), mbodypart(mtmp, STOMACH));
	    /* Skip "Contents of " by using fbuf index 12 */
	    pline("You %s to %s what is lying in %s.",
		Blind ? "try" : "look around", verb, &fbuf[12]);
	    otmp = mtmp->minvent;
	    if (otmp) {
		for ( ; otmp; otmp = otmp->nobj) {
		    /* If swallower is an animal, it should have become stone but... */
		    if (otmp->otyp == CORPSE && will_feel_cockatrice(otmp, FALSE))
			break;
		}
		if (otmp && !Stoned) {
		    pline("You %s here %s.", verb, doname_price(otmp));
		    feel_cockatrice(otmp, FALSE);
		    return 1;
		}
		if (Blind) strcpy(fbuf, "You feel");
		strcat(fbuf,":");
		display_minventory(mtmp, MINV_ALL, fbuf);
	    } else {
		pline("You %s no objects here.", verb);
	    }
	    return !!Blind;
	}
	if (!skip_objects && (trap = t_at(level, u.ux, u.uy)) && trap->tseen)
		pline("There is %s here.",
			an(trapexplain[trap->ttyp - 1]));

	otmp = level->objects[u.ux][u.uy];
	dfeature = dfeature_at(u.ux, u.uy, fbuf2);
	if (dfeature && !strcmp(dfeature, "pool of water") && Underwater)
		dfeature = NULL;

	if (Blind) {
		boolean drift = Is_airlevel(&u.uz) || Is_waterlevel(&u.uz);
		if (dfeature && !strncmp(dfeature, "altar ", 6)) {
		    /* don't say "altar" twice, dfeature has more info */
		    pline("You try to feel what is here.");
		} else {
		    pline("You try to feel what is %s%s.",
			drift ? "floating here" : "lying here on the ",
			drift ? ""		: surface(u.ux, u.uy));
		}
		if (dfeature && !drift && !strcmp(dfeature, surface(u.ux,u.uy)))
			dfeature = NULL;	/* ice already identifed */
		if (!can_reach_floor()) {
			pline("But you can't reach it!");
			return 0;
		}
	}

	if (dfeature)
		sprintf(fbuf, "There is %s here.", an(dfeature));

	if (!otmp || is_lava(level, u.ux, u.uy) || (is_pool(level, u.ux, u.uy) && !Underwater)) {
		if (dfeature) pline(fbuf);
		read_engr_at(u.ux, u.uy);
		if (!skip_objects && (Blind || !dfeature))
		    pline("You %s no objects here.", verb);
		return !!Blind;
	}
	/* we know there is something here */

	if (skip_objects) {
	    if (dfeature) pline(fbuf);
	    read_engr_at(u.ux, u.uy);
	    pline("There are %s%s objects here.",
		  (obj_cnt <= 10) ? "several" : "many",
		  picked_some ? " more" : "");

	} else if (!otmp->nexthere) {
	    /* only one object */
	    if (dfeature) pline(fbuf);
	    read_engr_at(u.ux, u.uy);
#ifdef INVISIBLE_OBJECTS
	    if (otmp->oinvis && !See_invisible) verb = "feel";
#endif
	    pline("You %s here %s.", verb, doname_price(otmp));
	    if (otmp->otyp == CORPSE && will_feel_cockatrice(otmp, FALSE) && !Stoned) {
		feel_cockatrice(otmp, FALSE);
		return 1;
	    }

	} else {
	    for (otmp = level->objects[u.ux][u.uy]; otmp; otmp = otmp->nexthere) {
		if (otmp->otyp == CORPSE && will_feel_cockatrice(otmp, FALSE))
		    break;
	    }
	    if (otmp && !Stoned) {
		pline("You %s here %s.", verb, doname_price(otmp));
		feel_cockatrice(otmp, FALSE);
		return 1;
	    }

	    items = malloc(size * sizeof(struct nh_objitem));
	    if (dfeature) {
		add_objitem(&items, &size, MI_TEXT, icount++, 0, fbuf, NULL, FALSE);
		add_objitem(&items, &size, MI_TEXT, icount++, 0, "", NULL, FALSE);
	    }

	    for (otmp = level->objects[u.ux][u.uy]; otmp; otmp = otmp->nexthere) {
		add_objitem(&items, &size, MI_NORMAL, icount++, 0,
			    doname(otmp), otmp, FALSE);
	    }

	    if (!skip_win)
		display_objects(items, icount, title, PICK_NONE, NULL);
	    free(items);

	    read_engr_at(u.ux, u.uy);
	}
	return !!Blind;
}